

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Arena.cpp
# Opt level: O0

void amrex::Arena::Finalize(void)

{
  int iVar1;
  long local_68;
  long local_40;
  long local_28;
  long local_10;
  
  iVar1 = Verbose();
  if (1 < iVar1) {
    PrintUsage();
  }
  (anonymous_namespace)::initialized = 0;
  if ((anonymous_namespace)::the_device_arena == (long *)0x0) {
    local_10 = 0;
  }
  else {
    local_10 = __dynamic_cast((anonymous_namespace)::the_device_arena,&typeinfo,&BArena::typeinfo,0)
    ;
  }
  if (local_10 == 0) {
    if (((anonymous_namespace)::the_device_arena != (anonymous_namespace)::the_arena) &&
       ((anonymous_namespace)::the_device_arena != (long *)0x0)) {
      (**(code **)(*(anonymous_namespace)::the_device_arena + 8))();
    }
    (anonymous_namespace)::the_device_arena = (long *)0x0;
  }
  if ((anonymous_namespace)::the_managed_arena == (long *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = __dynamic_cast((anonymous_namespace)::the_managed_arena,&typeinfo,&BArena::typeinfo,0
                             );
  }
  if (local_28 == 0) {
    if (((anonymous_namespace)::the_managed_arena != (anonymous_namespace)::the_arena) &&
       ((anonymous_namespace)::the_managed_arena != (long *)0x0)) {
      (**(code **)(*(anonymous_namespace)::the_managed_arena + 8))();
    }
    (anonymous_namespace)::the_managed_arena = (long *)0x0;
  }
  if ((anonymous_namespace)::the_arena == (long *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = __dynamic_cast((anonymous_namespace)::the_arena,&typeinfo,&BArena::typeinfo,0);
  }
  if (local_40 == 0) {
    if ((anonymous_namespace)::the_arena != (long *)0x0) {
      (**(code **)(*(anonymous_namespace)::the_arena + 8))();
    }
    (anonymous_namespace)::the_arena = (long *)0x0;
  }
  if ((anonymous_namespace)::the_async_arena != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::the_async_arena + 8))();
  }
  (anonymous_namespace)::the_async_arena = (long *)0x0;
  if ((anonymous_namespace)::the_pinned_arena != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::the_pinned_arena + 8))();
  }
  (anonymous_namespace)::the_pinned_arena = (long *)0x0;
  if ((anonymous_namespace)::the_cpu_arena == (long *)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = __dynamic_cast((anonymous_namespace)::the_cpu_arena,&typeinfo,&BArena::typeinfo,0);
  }
  if (local_68 == 0) {
    if ((anonymous_namespace)::the_cpu_arena != (long *)0x0) {
      (**(code **)(*(anonymous_namespace)::the_cpu_arena + 8))();
    }
    (anonymous_namespace)::the_cpu_arena = (long *)0x0;
  }
  return;
}

Assistant:

void
Arena::Finalize ()
{
#ifdef AMREX_USE_GPU
    if (amrex::Verbose() > 0) {
#else
    if (amrex::Verbose() > 1) {
#endif
        PrintUsage();
    }

    initialized = false;

    if (!dynamic_cast<BArena*>(the_device_arena)) {
        if (the_device_arena != the_arena) {
            delete the_device_arena;
        }
        the_device_arena = nullptr;
    }

    if (!dynamic_cast<BArena*>(the_managed_arena)) {
        if (the_managed_arena != the_arena) {
            delete the_managed_arena;
        }
        the_managed_arena = nullptr;
    }

    if (!dynamic_cast<BArena*>(the_arena)) {
        delete the_arena;
        the_arena = nullptr;
    }

    delete the_async_arena;
    the_async_arena = nullptr;

    delete the_pinned_arena;
    the_pinned_arena = nullptr;

    if (!dynamic_cast<BArena*>(the_cpu_arena)) {
        delete the_cpu_arena;
        the_cpu_arena = nullptr;
    }
}

Arena*
The_Arena ()
{
    if        (the_arena) {
        return the_arena;
    } else {
        return The_Null_Arena();
    }
}

Arena*
The_Async_Arena ()
{
    if        (the_async_arena) {
        return the_async_arena;
    } else {
        return The_Null_Arena();
    }
}

Arena*
The_Device_Arena ()
{
    if        (the_device_arena) {
        return the_device_arena;
    } else {
        return The_Null_Arena();
    }
}

Arena*
The_Managed_Arena ()
{
    if        (the_managed_arena) {
        return the_managed_arena;
    } else {
        return The_Null_Arena();
    }
}

Arena*
The_Pinned_Arena ()
{
    if        (the_pinned_arena) {
        return the_pinned_arena;
    } else {
        return The_Null_Arena();
    }
}

Arena*
The_Cpu_Arena ()
{
    if        (the_cpu_arena) {
        return the_cpu_arena;
    } else {
        return The_Null_Arena();
    }
}

}